

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O0

void __thiscall
cmCTestResourceGroupsLexerHelper::WriteRequirement(cmCTestResourceGroupsLexerHelper *this)

{
  value_type local_38;
  cmCTestResourceGroupsLexerHelper *local_10;
  cmCTestResourceGroupsLexerHelper *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&local_38,(string *)&this->ResourceType);
  local_38.SlotsNeeded = this->NeededSlots;
  local_38.UnitsNeeded = 1;
  std::
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  ::push_back(&this->Process,&local_38);
  cmCTestTestHandler::cmCTestTestResourceRequirement::~cmCTestTestResourceRequirement(&local_38);
  return;
}

Assistant:

void cmCTestResourceGroupsLexerHelper::WriteRequirement()
{
  this->Process.push_back({ this->ResourceType, this->NeededSlots, 1 });
}